

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_metadata_cb_iterate(set s,set_key key,set_value val,set_cb_iterate_args args)

{
  value pvVar1;
  long *in_RCX;
  loader_handle_impl in_RDX;
  loader_impl_metadata_cb_iterator metadata_iterator;
  
  pvVar1 = loader_impl_metadata_handle(in_RDX);
  *(value *)(in_RCX[1] + *in_RCX * 8) = pvVar1;
  if (*(long *)(in_RCX[1] + *in_RCX * 8) != 0) {
    *in_RCX = *in_RCX + 1;
  }
  return 0;
}

Assistant:

int loader_impl_metadata_cb_iterate(set s, set_key key, set_value val, set_cb_iterate_args args)
{
	loader_impl_metadata_cb_iterator metadata_iterator = (loader_impl_metadata_cb_iterator)args;

	(void)s;
	(void)key;

	metadata_iterator->values[metadata_iterator->iterator] = loader_impl_metadata_handle((loader_handle_impl)val);

	if (metadata_iterator->values[metadata_iterator->iterator] != NULL)
	{
		++metadata_iterator->iterator;
	}

	return 0;
}